

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O1

void BrotliSplitBlock(MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
                     size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  HistogramPair *pHVar4;
  ushort uVar5;
  Command *pCVar6;
  ulong uVar7;
  uint8_t *puVar8;
  HistogramLiteral *pHVar9;
  uint32_t *puVar10;
  void *pvVar11;
  uint16_t *puVar12;
  HistogramCommand *pHVar13;
  void *pvVar14;
  ulong uVar15;
  ushort *puVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  ulong uVar20;
  HistogramDistance *pHVar21;
  uint32_t *puVar22;
  int iVar23;
  size_t sVar24;
  size_t sVar25;
  long lVar26;
  ulong uVar27;
  char *pcVar28;
  byte bVar29;
  uint32_t uVar30;
  byte *pbVar31;
  uint *puVar32;
  uint uVar33;
  ulong uVar34;
  byte bVar35;
  size_t sVar36;
  ulong uVar37;
  size_t __n;
  void *pvVar38;
  uint uVar39;
  size_t __n_00;
  uint *puVar40;
  long lVar41;
  void *pvVar42;
  ulong uVar43;
  long lVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  uint32_t *local_ff8;
  ulong local_ff0;
  void *local_fe0;
  HistogramCommand *local_fd8;
  ulong local_fd0;
  HistogramDistance *local_fc8;
  HistogramCommand *local_fc0;
  double local_fb8;
  uint32_t *local_fb0;
  uint32_t *local_fa8;
  uint32_t *local_fa0;
  ulong local_f98;
  void *local_f90;
  void *local_f88;
  void *local_f80;
  ulong local_f78;
  ulong local_f70;
  HistogramPair *local_f68;
  ulong local_f60;
  HistogramPair *local_f50;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [1032];
  double local_738;
  ulong local_320;
  double local_318;
  ulong local_40;
  double local_38;
  
  if (num_commands == 0) {
    sVar36 = 0;
  }
  else {
    sVar36 = 0;
    pCVar6 = cmds;
    sVar24 = num_commands;
    do {
      sVar36 = sVar36 + pCVar6->insert_len_;
      pCVar6 = pCVar6 + 1;
      sVar24 = sVar24 - 1;
    } while (sVar24 != 0);
  }
  if (sVar36 == 0) {
    local_fe0 = (void *)0x0;
  }
  else {
    local_fe0 = BrotliAllocate(m,sVar36);
  }
  if (num_commands != 0) {
    puVar10 = &cmds->copy_len_;
    lVar41 = 0;
    sVar24 = num_commands;
    do {
      uVar43 = pos & mask;
      __n = (size_t)((Command *)(puVar10 + -1))->insert_len_;
      if (mask < uVar43 + __n) {
        __n_00 = (mask + 1) - uVar43;
        memcpy((void *)((long)local_fe0 + lVar41),data + uVar43,__n_00);
        lVar41 = lVar41 + __n_00;
        __n = __n - __n_00;
        uVar43 = 0;
      }
      if (__n != 0) {
        memcpy((void *)((long)local_fe0 + lVar41),data + uVar43,__n);
        lVar41 = lVar41 + __n;
      }
      pos = (ulong)(*puVar10 & 0xffffff) + __n + uVar43;
      puVar10 = puVar10 + 4;
      sVar24 = sVar24 - 1;
    } while (sVar24 != 0);
  }
  uVar43 = 100;
  if (sVar36 < 0xd480) {
    uVar43 = sVar36 / 0x220 + 1;
  }
  if (sVar36 == 0) {
    literal_split->num_types = 1;
  }
  else if (sVar36 < 0x80) {
    uVar43 = literal_split->types_alloc_size;
    uVar7 = literal_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar15 = uVar43;
        uVar43 = uVar15 * 2;
      } while (uVar15 < uVar7);
      if (uVar15 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar15);
      }
      if (literal_split->types_alloc_size != 0) {
        memcpy(puVar8,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar8;
      literal_split->types_alloc_size = uVar15;
    }
    uVar43 = literal_split->lengths_alloc_size;
    uVar7 = literal_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar15 = uVar43;
        uVar43 = uVar15 * 2;
      } while (uVar15 < uVar7);
      if (uVar15 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar15 * 4);
      }
      if (literal_split->lengths_alloc_size != 0) {
        memcpy(puVar10,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar10;
      literal_split->lengths_alloc_size = uVar15;
    }
    literal_split->num_types = 1;
    literal_split->types[literal_split->num_blocks] = '\0';
    sVar24 = literal_split->num_blocks;
    literal_split->lengths[sVar24] = (uint32_t)sVar36;
    literal_split->num_blocks = sVar24 + 1;
  }
  else {
    pvVar42 = BrotliAllocate(m,uVar43 * 0x410);
    uVar7 = uVar43;
    pvVar11 = pvVar42;
    do {
      memset(pvVar11,0,0x408);
      *(undefined8 *)((long)pvVar11 + 0x408) = 0x7ff0000000000000;
      pvVar11 = (void *)((long)pvVar11 + 0x410);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar7 = 0;
    iVar23 = 7;
    do {
      uVar15 = (uVar7 * sVar36) / uVar43;
      if (uVar7 != 0) {
        uVar34 = (ulong)(uint)(iVar23 * 0x41a7);
        if (iVar23 == 0) {
          uVar34 = 1;
        }
        uVar15 = uVar15 + uVar34 % (sVar36 / uVar43);
        iVar23 = (int)uVar34;
      }
      if (sVar36 <= uVar15 + 0x46) {
        uVar15 = sVar36 - 0x47;
      }
      plVar2 = (long *)((long)pvVar42 + uVar7 * 0x410 + 0x400);
      *plVar2 = *plVar2 + 0x46;
      lVar41 = -0x46;
      do {
        piVar1 = (int *)((long)pvVar42 +
                        (ulong)*(byte *)((long)local_fe0 + lVar41 + uVar15 + 0x46) * 4 +
                        uVar7 * 0x410);
        *piVar1 = *piVar1 + 1;
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar43);
    uVar7 = (sVar36 * 2) / 0x46 + uVar43 + 99;
    if (uVar7 != uVar7 % uVar43) {
      uVar34 = 7;
      uVar15 = 0;
      do {
        memset(local_b40,0,0x408);
        uVar39 = (int)uVar34 * 0x41a7;
        if ((int)uVar34 == 0) {
          uVar39 = 1;
        }
        uVar34 = (ulong)uVar39;
        local_738 = INFINITY;
        pbVar31 = (byte *)(uVar34 % (sVar36 - 0x45) + (long)local_fe0);
        local_b40._1024_8_ = 0x46;
        lVar41 = -0x46;
        do {
          bVar29 = *pbVar31;
          pbVar31 = pbVar31 + 1;
          *(int *)(local_b40 + (ulong)bVar29 * 4) = *(int *)(local_b40 + (ulong)bVar29 * 4) + 1;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 0);
        lVar41 = (uVar15 % uVar43) * 0x410;
        plVar2 = (long *)((long)pvVar42 + lVar41 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        lVar26 = 0;
        do {
          piVar1 = (int *)((long)pvVar42 + lVar26 * 4 + lVar41);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x100);
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar7 - uVar7 % uVar43);
    }
    pvVar11 = BrotliAllocate(m,sVar36);
    pvVar14 = BrotliAllocate(m,uVar43 << 0xb);
    pvVar17 = BrotliAllocate(m,uVar43 * 8);
    sVar24 = (uVar43 + 7 >> 3) * sVar36;
    if (sVar24 == 0) {
      local_f88 = (void *)0x0;
    }
    else {
      local_f88 = BrotliAllocate(m,sVar24);
    }
    pvVar18 = BrotliAllocate(m,uVar43 * 2);
    lVar41 = 3;
    if (10 < params->quality) {
      lVar41 = 10;
    }
    sVar24 = sVar36 - 1;
    lVar26 = 0;
    do {
      if (uVar43 < 2) {
        memset(pvVar11,0,sVar36);
LAB_00111cb1:
        uVar7 = 1;
      }
      else {
        uVar15 = uVar43 + 7 >> 3;
        memset(pvVar14,0,uVar43 << 0xb);
        uVar7 = 0;
        puVar32 = (uint *)((long)pvVar42 + 0x400);
        do {
          uVar34 = (ulong)*puVar32;
          if (uVar34 < 0x100) {
            dVar46 = (double)kLog2Table[uVar34];
          }
          else {
            dVar46 = log2((double)uVar34);
          }
          *(double *)((long)pvVar14 + uVar7 * 8) = dVar46;
          uVar7 = uVar7 + 1;
          puVar32 = puVar32 + 0x104;
        } while (uVar43 != uVar7);
        pvVar19 = (void *)(uVar43 * 0x7f8 + (long)pvVar14);
        lVar44 = 0x100;
        puVar32 = (uint *)((long)pvVar42 + 0x3fc);
        do {
          lVar44 = lVar44 + -1;
          uVar7 = 0;
          puVar40 = puVar32;
          do {
            dVar46 = *(double *)((long)pvVar14 + uVar7 * 8);
            uVar34 = (ulong)*puVar40;
            dVar45 = -2.0;
            if (uVar34 != 0) {
              if (*puVar40 < 0x100) {
                dVar45 = (double)kLog2Table[uVar34];
              }
              else {
                dVar45 = log2((double)uVar34);
              }
            }
            *(double *)((long)pvVar19 + uVar7 * 8) = dVar46 - dVar45;
            uVar7 = uVar7 + 1;
            puVar40 = puVar40 + 0x104;
          } while (uVar43 != uVar7);
          pvVar19 = (void *)((long)pvVar19 + uVar43 * -8);
          puVar32 = puVar32 + -1;
        } while (lVar44 != 0);
        memset(pvVar17,0,uVar43 * 8);
        memset(local_f88,0,uVar15 * sVar36);
        uVar7 = 0;
        do {
          bVar29 = *(byte *)((long)local_fe0 + uVar7);
          uVar34 = 0;
          dVar46 = 1e+99;
          do {
            dVar45 = *(double *)((long)pvVar14 + uVar34 * 8 + bVar29 * uVar43 * 8) +
                     *(double *)((long)pvVar17 + uVar34 * 8);
            *(double *)((long)pvVar17 + uVar34 * 8) = dVar45;
            if (dVar45 < dVar46) {
              *(char *)((long)pvVar11 + uVar7) = (char)uVar34;
              dVar46 = dVar45;
            }
            uVar34 = uVar34 + 1;
          } while (uVar43 != uVar34);
          dVar45 = 28.1;
          if (uVar7 < 2000) {
            dVar45 = (((double)(long)uVar7 * 0.07) / 2000.0 + 0.77) * 28.1;
          }
          uVar34 = 0;
          do {
            dVar47 = *(double *)((long)pvVar17 + uVar34 * 8) - dVar46;
            *(double *)((long)pvVar17 + uVar34 * 8) = dVar47;
            if (dVar45 <= dVar47) {
              *(double *)((long)pvVar17 + uVar34 * 8) = dVar45;
              if (uVar15 <= uVar34 >> 3) {
                pcVar28 = 
                "size_t FindBlocksLiteral(const uint8_t *, const size_t, const double, const size_t, const HistogramLiteral *, double *, double *, uint8_t *, uint8_t *)"
                ;
                goto LAB_00114edc;
              }
              pbVar31 = (byte *)((long)local_f88 + (uVar34 >> 3) + uVar7 * uVar15);
              *pbVar31 = *pbVar31 | '\x01' << ((byte)uVar34 & 7);
            }
            uVar34 = uVar34 + 1;
          } while (uVar43 != uVar34);
          uVar7 = uVar7 + 1;
        } while (uVar7 != sVar36);
        if (sVar24 == 0) goto LAB_00111cb1;
        bVar29 = *(byte *)((long)pvVar11 + sVar24);
        pvVar19 = (void *)((sVar36 - 2) * uVar15 + (long)local_f88);
        uVar7 = 1;
        sVar25 = sVar36;
        do {
          if (uVar15 <= bVar29 >> 3) {
            pcVar28 = 
            "size_t FindBlocksLiteral(const uint8_t *, const size_t, const double, const size_t, const HistogramLiteral *, double *, double *, uint8_t *, uint8_t *)"
            ;
            goto LAB_00114fc3;
          }
          if ((*(byte *)((long)pvVar19 + (ulong)(bVar29 >> 3)) >> (bVar29 & 7) & 1) != 0) {
            bVar35 = *(byte *)((long)pvVar11 + (sVar25 - 2));
            uVar7 = uVar7 + (bVar29 != bVar35);
            bVar29 = bVar35;
          }
          *(byte *)((long)pvVar11 + (sVar25 - 2)) = bVar29;
          pvVar19 = (void *)((long)pvVar19 - uVar15);
          sVar25 = sVar25 - 1;
        } while (sVar25 != 1);
      }
      if (uVar43 != 0) {
        uVar15 = 0;
        do {
          *(undefined2 *)((long)pvVar18 + uVar15 * 2) = 0x100;
          uVar15 = uVar15 + 1;
        } while (uVar43 != uVar15);
      }
      sVar25 = 0;
      uVar5 = 0;
      do {
        uVar15 = (ulong)*(byte *)((long)pvVar11 + sVar25);
        if (uVar43 <= uVar15) {
          pcVar28 = "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)"
          ;
          goto LAB_00114f57;
        }
        if (*(short *)((long)pvVar18 + uVar15 * 2) == 0x100) {
          *(ushort *)((long)pvVar18 + uVar15 * 2) = uVar5;
          uVar5 = uVar5 + 1;
        }
        sVar25 = sVar25 + 1;
      } while (sVar36 != sVar25);
      uVar15 = (ulong)uVar5;
      sVar25 = 0;
      do {
        bVar29 = (byte)*(undefined2 *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar11 + sVar25) * 2)
        ;
        *(byte *)((long)pvVar11 + sVar25) = bVar29;
        if (uVar43 <= bVar29) {
          pcVar28 = "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)"
          ;
          goto LAB_00114f76;
        }
        sVar25 = sVar25 + 1;
      } while (sVar36 != sVar25);
      if (uVar43 < uVar15) {
        pcVar28 = "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)";
        goto LAB_0011503e;
      }
      if (uVar5 != 0) {
        lVar44 = 0;
        do {
          memset((void *)((long)pvVar42 + lVar44),0,0x408);
          *(undefined8 *)((long)pvVar42 + lVar44 + 0x408) = 0x7ff0000000000000;
          lVar44 = lVar44 + 0x410;
        } while (uVar15 * 0x410 - lVar44 != 0);
      }
      sVar25 = 0;
      do {
        lVar44 = (ulong)*(byte *)((long)pvVar11 + sVar25) * 0x410;
        piVar1 = (int *)((long)pvVar42 + (ulong)*(byte *)((long)local_fe0 + sVar25) * 4 + lVar44);
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar42 + lVar44 + 0x400);
        *plVar2 = *plVar2 + 1;
        sVar25 = sVar25 + 1;
      } while (sVar36 != sVar25);
      lVar26 = lVar26 + 1;
      uVar43 = uVar15;
    } while (lVar26 != lVar41);
    BrotliFree(m,pvVar14);
    BrotliFree(m,pvVar17);
    BrotliFree(m,local_f88);
    BrotliFree(m,pvVar18);
    BrotliFree(m,pvVar42);
    if (uVar7 == 0) {
      local_fa8 = (uint32_t *)0x0;
      pvVar42 = (void *)0x0;
    }
    else {
      local_fa8 = (uint32_t *)BrotliAllocate(m,uVar7 * 4);
      pvVar42 = BrotliAllocate(m,uVar7 * 4);
    }
    uVar43 = uVar7 * 0x10 + 0x3f0;
    local_f78 = uVar43 >> 6;
    if (uVar43 < 0x40) {
      local_fc0 = (HistogramCommand *)0x0;
      local_fb0 = (uint32_t *)0x0;
    }
    else {
      local_fc0 = (HistogramCommand *)BrotliAllocate(m,local_f78 * 0x410);
      local_fb0 = (uint32_t *)BrotliAllocate(m,local_f78 * 4);
    }
    if (uVar7 == 0) {
      local_fd8 = (HistogramCommand *)0x0;
    }
    else {
      uVar43 = 0x40;
      if (uVar7 < 0x40) {
        uVar43 = uVar7;
      }
      local_fd8 = (HistogramCommand *)BrotliAllocate(m,uVar43 * 0x410);
    }
    local_f50 = (HistogramPair *)BrotliAllocate(m,0xc018);
    uVar43 = 0;
    memset(sizes,0,0x100);
    memset(new_clusters,0,0x100);
    memset(symbols,0,0x100);
    memset(remap,0,0x100);
    memset(pvVar42,0,uVar7 * 4);
    sVar25 = 0;
    do {
      if (uVar7 <= uVar43) {
        pcVar28 = 
        "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
        ;
        goto LAB_0011505d;
      }
      piVar1 = (int *)((long)pvVar42 + uVar43 * 4);
      *piVar1 = *piVar1 + 1;
      if ((sVar24 == sVar25) ||
         (*(char *)((long)pvVar11 + sVar25) != *(char *)((long)pvVar11 + sVar25 + 1))) {
        uVar43 = uVar43 + 1;
      }
      sVar25 = sVar25 + 1;
    } while (sVar36 != sVar25);
    if (uVar43 != uVar7) {
      pcVar28 = 
      "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
      ;
      goto LAB_00115144;
    }
    if (uVar7 == 0) {
      uVar43 = 0;
    }
    else {
      local_f98 = 0;
      local_fa0 = (uint32_t *)0x0;
      local_ff0 = 0;
      uVar43 = 0;
      local_fb8 = 0.0;
      puVar10 = local_fa8;
      uVar15 = uVar7;
      local_f60 = local_f78;
      do {
        uVar34 = 0x40;
        if (uVar15 < 0x40) {
          uVar34 = uVar15;
        }
        lVar41 = uVar34 + (uVar34 == 0);
        lVar26 = 0;
        do {
          pHVar9 = (HistogramLiteral *)((long)local_fd8 + lVar26 * 0x410);
          memset(pHVar9,0,0x408);
          ((HistogramLiteral *)((long)local_fd8 + lVar26 * 0x410))->bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar42 + (local_ff0 + lVar26) * 4) != 0) {
            sVar36 = pHVar9->total_count_;
            uVar34 = 0;
            do {
              pHVar9->data_[*(byte *)((long)local_fe0 + uVar34 + (long)local_fb8)] =
                   pHVar9->data_[*(byte *)((long)local_fe0 + uVar34 + (long)local_fb8)] + 1;
              pHVar9->total_count_ = sVar36 + 1 + uVar34;
              uVar34 = uVar34 + 1;
            } while (uVar34 < *(uint *)((long)pvVar42 + (local_ff0 + lVar26) * 4));
            local_fb8 = (double)((long)local_fb8 + uVar34);
          }
          dVar46 = BrotliPopulationCostLiteral(pHVar9);
          pHVar9->bit_cost_ = dVar46;
          new_clusters[lVar26] = (uint32_t)lVar26;
          symbols[lVar26] = (uint32_t)lVar26;
          sizes[lVar26] = 1;
          lVar26 = lVar26 + 1;
        } while (lVar26 != lVar41);
        sVar36 = uVar7 - local_ff0;
        if (0x3f < sVar36) {
          sVar36 = 0x40;
        }
        sVar36 = BrotliHistogramCombineLiteral
                           ((HistogramLiteral *)local_fd8,sizes,symbols,new_clusters,local_f50,
                            sVar36,sVar36,0x40,0x800);
        uVar34 = local_f98 + sVar36;
        if (local_f60 < uVar34) {
          uVar37 = local_f60;
          if (local_f60 == 0) {
            uVar37 = uVar34;
          }
          do {
            uVar20 = uVar37;
            uVar37 = uVar20 * 2;
          } while (uVar20 < uVar34);
          if (uVar20 == 0) {
            pHVar9 = (HistogramLiteral *)0x0;
          }
          else {
            pHVar9 = (HistogramLiteral *)BrotliAllocate(m,uVar20 * 0x410);
          }
          if (local_f60 != 0) {
            memcpy(pHVar9,local_fc0,local_f60 * 0x410);
          }
          BrotliFree(m,local_fc0);
          local_fc0 = (HistogramCommand *)pHVar9;
          local_f60 = uVar20;
        }
        uVar34 = (long)local_fa0 + sVar36;
        if (local_f78 < uVar34) {
          uVar37 = local_f78;
          if (local_f78 == 0) {
            uVar37 = uVar34;
          }
          do {
            uVar20 = uVar37;
            uVar37 = uVar20 * 2;
          } while (uVar20 < uVar34);
          if (uVar20 == 0) {
            puVar22 = (uint32_t *)0x0;
          }
          else {
            puVar22 = (uint32_t *)BrotliAllocate(m,uVar20 * 4);
          }
          if (local_f78 != 0) {
            memcpy(puVar22,local_fb0,local_f78 << 2);
          }
          BrotliFree(m,local_fb0);
          local_fb0 = puVar22;
          local_f78 = uVar20;
        }
        if (sVar36 != 0) {
          pHVar9 = (HistogramLiteral *)((long)local_fc0 + local_f98 * 0x410);
          sVar24 = 0;
          do {
            uVar39 = new_clusters[sVar24];
            memcpy(pHVar9,(HistogramLiteral *)((long)local_fd8 + (ulong)uVar39 * 0x410),0x410);
            local_fb0[(long)local_fa0 + sVar24] = sizes[uVar39];
            remap[new_clusters[sVar24]] = (uint32_t)sVar24;
            sVar24 = sVar24 + 1;
            pHVar9 = pHVar9 + 1;
          } while (sVar36 != sVar24);
          local_f98 = local_f98 + sVar24;
          local_fa0 = (uint32_t *)((long)local_fa0 + sVar24);
        }
        lVar26 = 0;
        do {
          puVar10[lVar26] = remap[symbols[lVar26]] + (int)uVar43;
          lVar26 = lVar26 + 1;
        } while (lVar41 != lVar26);
        uVar43 = sVar36 + uVar43;
        if ((uint32_t *)uVar43 != local_fa0) {
          pcVar28 = 
          "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_001150d8;
        }
        if (uVar43 != local_f98) {
          pcVar28 = 
          "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_001150f7;
        }
        local_ff0 = local_ff0 + 0x40;
        uVar15 = uVar15 - 0x40;
        puVar10 = puVar10 + 0x40;
      } while (local_ff0 < uVar7);
    }
    BrotliFree(m,local_fd8);
    uVar15 = (uVar43 >> 1) * uVar43;
    if (uVar43 << 6 < uVar15) {
      uVar15 = uVar43 << 6;
    }
    if (0x800 < uVar15) {
      BrotliFree(m,local_f50);
      local_f50 = (HistogramPair *)BrotliAllocate(m,uVar15 * 0x18 + 0x18);
    }
    if (uVar43 == 0) {
      puVar10 = (uint32_t *)0x0;
    }
    else {
      puVar10 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
      uVar34 = 0;
      do {
        puVar10[uVar34] = (uint32_t)uVar34;
        uVar34 = uVar34 + 1;
      } while (uVar43 != uVar34);
    }
    sVar36 = BrotliHistogramCombineLiteral
                       ((HistogramLiteral *)local_fc0,local_fb0,local_fa8,puVar10,local_f50,uVar43,
                        uVar7,0x100,uVar15);
    BrotliFree(m,local_f50);
    BrotliFree(m,local_fb0);
    if (uVar43 == 0) {
      pvVar14 = (void *)0x0;
    }
    else {
      pvVar14 = BrotliAllocate(m,uVar43 * 4);
      memset(pvVar14,0xff,uVar43 << 2);
    }
    if (uVar7 != 0) {
      iVar23 = 0;
      uVar43 = 0;
      local_ff0 = 0;
      do {
        memset(local_b40,0,0x408);
        local_738 = INFINITY;
        if (*(int *)((long)pvVar42 + uVar43 * 4) != 0) {
          uVar15 = 0;
          do {
            *(int *)(local_b40 + (ulong)*(byte *)((long)local_fe0 + uVar15 + local_ff0) * 4) =
                 *(int *)(local_b40 + (ulong)*(byte *)((long)local_fe0 + uVar15 + local_ff0) * 4) +
                 1;
            uVar15 = uVar15 + 1;
          } while (uVar15 < *(uint *)((long)pvVar42 + uVar43 * 4));
          local_ff0 = local_ff0 + uVar15;
          local_b40._1024_8_ = uVar15;
        }
        lVar41 = 0;
        if (uVar43 != 0) {
          lVar41 = uVar43 - 1;
        }
        uVar39 = local_fa8[lVar41];
        uVar15 = (ulong)uVar39;
        local_fb8 = BrotliHistogramBitCostDistanceLiteral
                              ((HistogramLiteral *)local_b40,
                               (HistogramLiteral *)((long)local_fc0 + uVar15 * 0x410));
        if (sVar36 != 0) {
          sVar24 = 0;
          do {
            dVar46 = BrotliHistogramBitCostDistanceLiteral
                               ((HistogramLiteral *)local_b40,
                                (HistogramLiteral *)
                                ((long)local_fc0 + (ulong)puVar10[sVar24] * 0x410));
            if (dVar46 < local_fb8) {
              uVar15 = (ulong)puVar10[sVar24];
              local_fb8 = dVar46;
            }
            uVar39 = (uint)uVar15;
            sVar24 = sVar24 + 1;
          } while (sVar36 != sVar24);
        }
        local_fa8[uVar43] = uVar39;
        if (*(int *)((long)pvVar14 + (ulong)uVar39 * 4) == -1) {
          *(int *)((long)pvVar14 + (ulong)uVar39 * 4) = iVar23;
          iVar23 = iVar23 + 1;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != uVar7);
    }
    BrotliFree(m,puVar10);
    BrotliFree(m,local_fc0);
    uVar43 = literal_split->types_alloc_size;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar15 = uVar43;
        uVar43 = uVar15 * 2;
      } while (uVar15 < uVar7);
      if (uVar15 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar15);
      }
      if (literal_split->types_alloc_size != 0) {
        memcpy(puVar8,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar8;
      literal_split->types_alloc_size = uVar15;
    }
    uVar43 = literal_split->lengths_alloc_size;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar15 = uVar43;
        uVar43 = uVar15 * 2;
      } while (uVar15 < uVar7);
      if (uVar15 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar15 * 4);
      }
      if (literal_split->lengths_alloc_size != 0) {
        memcpy(puVar10,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar10;
      literal_split->lengths_alloc_size = uVar15;
    }
    uVar30 = 0;
    if (uVar7 == 0) {
      sVar24 = 1;
      sVar36 = 0;
    }
    else {
      sVar36 = 0;
      uVar43 = 0;
      uVar39 = 0;
      do {
        uVar30 = uVar30 + *(int *)((long)pvVar42 + uVar43 * 4);
        if ((uVar7 - 1 == uVar43) || (local_fa8[uVar43] != local_fa8[uVar43 + 1])) {
          uVar33 = uVar39 & 0xff;
          uVar3 = *(uint *)((long)pvVar14 + (ulong)local_fa8[uVar43] * 4);
          bVar35 = (byte)uVar3;
          literal_split->types[sVar36] = bVar35;
          bVar29 = (byte)uVar39;
          uVar39 = uVar3;
          if (bVar35 < bVar29) {
            uVar39 = uVar33;
          }
          literal_split->lengths[sVar36] = uVar30;
          sVar36 = sVar36 + 1;
          uVar30 = 0;
        }
        uVar43 = uVar43 + 1;
      } while (uVar7 != uVar43);
      sVar24 = (ulong)(uVar39 & 0xff) + 1;
    }
    literal_split->num_blocks = sVar36;
    literal_split->num_types = sVar24;
    BrotliFree(m,pvVar14);
    BrotliFree(m,pvVar42);
    BrotliFree(m,local_fa8);
    BrotliFree(m,pvVar11);
  }
  BrotliFree(m,local_fe0);
  if (num_commands == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = BrotliAllocate(m,num_commands * 2);
    puVar12 = &cmds->cmd_prefix_;
    sVar36 = 0;
    do {
      *(uint16_t *)((long)pvVar11 + sVar36 * 2) = *puVar12;
      sVar36 = sVar36 + 1;
      puVar12 = puVar12 + 8;
    } while (num_commands != sVar36);
  }
  uVar43 = 0x32;
  if (num_commands < 0x6784) {
    uVar43 = num_commands / 0x212 + 1;
  }
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
  }
  else if (num_commands < 0x80) {
    uVar43 = insert_and_copy_split->types_alloc_size;
    uVar7 = insert_and_copy_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar15 = uVar43;
        uVar43 = uVar15 * 2;
      } while (uVar15 < uVar7);
      if (uVar15 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar15);
      }
      if (insert_and_copy_split->types_alloc_size != 0) {
        memcpy(puVar8,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar8;
      insert_and_copy_split->types_alloc_size = uVar15;
    }
    uVar43 = insert_and_copy_split->lengths_alloc_size;
    uVar7 = insert_and_copy_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar15 = uVar43;
        uVar43 = uVar15 * 2;
      } while (uVar15 < uVar7);
      if (uVar15 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar15 * 4);
      }
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        memcpy(puVar10,insert_and_copy_split->lengths,insert_and_copy_split->lengths_alloc_size << 2
              );
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar10;
      insert_and_copy_split->lengths_alloc_size = uVar15;
    }
    insert_and_copy_split->num_types = 1;
    insert_and_copy_split->types[insert_and_copy_split->num_blocks] = '\0';
    sVar36 = insert_and_copy_split->num_blocks;
    insert_and_copy_split->lengths[sVar36] = (uint32_t)num_commands;
    insert_and_copy_split->num_blocks = sVar36 + 1;
  }
  else {
    pvVar14 = BrotliAllocate(m,uVar43 * 0xb10);
    pvVar42 = pvVar14;
    uVar7 = uVar43;
    do {
      memset(pvVar42,0,0xb08);
      *(undefined8 *)((long)pvVar42 + 0xb08) = 0x7ff0000000000000;
      pvVar42 = (void *)((long)pvVar42 + 0xb10);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar7 = 0;
    iVar23 = 7;
    do {
      uVar15 = (uVar7 * num_commands) / uVar43;
      if (uVar7 != 0) {
        uVar34 = (ulong)(uint)(iVar23 * 0x41a7);
        if (iVar23 == 0) {
          uVar34 = 1;
        }
        uVar15 = uVar15 + uVar34 % (num_commands / uVar43);
        iVar23 = (int)uVar34;
      }
      if (num_commands <= uVar15 + 0x28) {
        uVar15 = num_commands - 0x29;
      }
      plVar2 = (long *)((long)pvVar14 + uVar7 * 0xb10 + 0xb00);
      *plVar2 = *plVar2 + 0x28;
      lVar41 = 0;
      do {
        piVar1 = (int *)((long)pvVar14 +
                        (ulong)*(ushort *)((long)pvVar11 + lVar41 * 2 + uVar15 * 2) * 4 +
                        uVar7 * 0xb10);
        *piVar1 = *piVar1 + 1;
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0x28);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar43);
    uVar7 = (num_commands * 2) / 0x28 + uVar43 + 99;
    if (uVar7 != uVar7 % uVar43) {
      uVar34 = 7;
      uVar15 = 0;
      do {
        memset(local_b40,0,0xb08);
        uVar39 = (int)uVar34 * 0x41a7;
        if ((int)uVar34 == 0) {
          uVar39 = 1;
        }
        uVar34 = (ulong)uVar39;
        local_38 = INFINITY;
        puVar16 = (ushort *)((long)pvVar11 + (uVar34 % (num_commands - 0x27)) * 2);
        local_40 = 0x28;
        lVar41 = -0x28;
        do {
          uVar5 = *puVar16;
          puVar16 = puVar16 + 1;
          *(int *)(local_b40 + (ulong)uVar5 * 4) = *(int *)(local_b40 + (ulong)uVar5 * 4) + 1;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 0);
        lVar41 = (uVar15 % uVar43) * 0xb10;
        plVar2 = (long *)((long)pvVar14 + lVar41 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        lVar26 = 0;
        do {
          piVar1 = (int *)((long)pvVar14 + lVar26 * 4 + lVar41);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x2c0);
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar7 - uVar7 % uVar43);
    }
    pvVar42 = BrotliAllocate(m,num_commands);
    pvVar17 = BrotliAllocate(m,uVar43 * 0x1600);
    pvVar18 = BrotliAllocate(m,uVar43 * 8);
    sVar36 = (uVar43 + 7 >> 3) * num_commands;
    if (sVar36 == 0) {
      local_f90 = (void *)0x0;
    }
    else {
      local_f90 = BrotliAllocate(m,sVar36);
    }
    pvVar19 = BrotliAllocate(m,uVar43 * 2);
    lVar41 = 3;
    if (10 < params->quality) {
      lVar41 = 10;
    }
    sVar36 = num_commands - 1;
    lVar26 = 0;
    do {
      if (uVar43 < 2) {
        memset(pvVar42,0,num_commands);
LAB_00112f61:
        uVar15 = 1;
      }
      else {
        uVar7 = uVar43 + 7 >> 3;
        memset(pvVar17,0,uVar43 * 0x1600);
        uVar15 = 0;
        puVar32 = (uint *)((long)pvVar14 + 0xb00);
        do {
          uVar34 = (ulong)*puVar32;
          if (uVar34 < 0x100) {
            dVar46 = (double)kLog2Table[uVar34];
          }
          else {
            dVar46 = log2((double)uVar34);
          }
          *(double *)((long)pvVar17 + uVar15 * 8) = dVar46;
          uVar15 = uVar15 + 1;
          puVar32 = puVar32 + 0x2c4;
        } while (uVar43 != uVar15);
        pvVar38 = (void *)(uVar43 * 0x15f8 + (long)pvVar17);
        lVar44 = 0x2c0;
        puVar32 = (uint *)((long)pvVar14 + 0xafc);
        do {
          lVar44 = lVar44 + -1;
          uVar15 = 0;
          puVar40 = puVar32;
          do {
            dVar46 = *(double *)((long)pvVar17 + uVar15 * 8);
            uVar34 = (ulong)*puVar40;
            dVar45 = -2.0;
            if (uVar34 != 0) {
              if (*puVar40 < 0x100) {
                dVar45 = (double)kLog2Table[uVar34];
              }
              else {
                dVar45 = log2((double)uVar34);
              }
            }
            *(double *)((long)pvVar38 + uVar15 * 8) = dVar46 - dVar45;
            uVar15 = uVar15 + 1;
            puVar40 = puVar40 + 0x2c4;
          } while (uVar43 != uVar15);
          pvVar38 = (void *)((long)pvVar38 + uVar43 * -8);
          puVar32 = puVar32 + -1;
        } while (lVar44 != 0);
        memset(pvVar18,0,uVar43 * 8);
        memset(local_f90,0,uVar7 * num_commands);
        uVar15 = 0;
        do {
          uVar5 = *(ushort *)((long)pvVar11 + uVar15 * 2);
          uVar34 = 0;
          dVar46 = 1e+99;
          do {
            dVar45 = *(double *)((long)pvVar17 + uVar34 * 8 + uVar5 * uVar43 * 8) +
                     *(double *)((long)pvVar18 + uVar34 * 8);
            *(double *)((long)pvVar18 + uVar34 * 8) = dVar45;
            if (dVar45 < dVar46) {
              *(char *)((long)pvVar42 + uVar15) = (char)uVar34;
              dVar46 = dVar45;
            }
            uVar34 = uVar34 + 1;
          } while (uVar43 != uVar34);
          dVar45 = 13.5;
          if (uVar15 < 2000) {
            dVar45 = (((double)(long)uVar15 * 0.07) / 2000.0 + 0.77) * 13.5;
          }
          uVar34 = 0;
          do {
            dVar47 = *(double *)((long)pvVar18 + uVar34 * 8) - dVar46;
            *(double *)((long)pvVar18 + uVar34 * 8) = dVar47;
            if (dVar45 <= dVar47) {
              *(double *)((long)pvVar18 + uVar34 * 8) = dVar45;
              if (uVar7 <= uVar34 >> 3) {
                pcVar28 = 
                "size_t FindBlocksCommand(const uint16_t *, const size_t, const double, const size_t, const HistogramCommand *, double *, double *, uint8_t *, uint8_t *)"
                ;
                goto LAB_00114edc;
              }
              pbVar31 = (byte *)((long)local_f90 + (uVar34 >> 3) + uVar15 * uVar7);
              *pbVar31 = *pbVar31 | '\x01' << ((byte)uVar34 & 7);
            }
            uVar34 = uVar34 + 1;
          } while (uVar43 != uVar34);
          uVar15 = uVar15 + 1;
        } while (uVar15 != num_commands);
        if (sVar36 == 0) goto LAB_00112f61;
        bVar29 = *(byte *)((long)pvVar42 + sVar36);
        pvVar38 = (void *)((num_commands - 2) * uVar7 + (long)local_f90);
        uVar15 = 1;
        sVar24 = num_commands;
        do {
          if (uVar7 <= bVar29 >> 3) {
            pcVar28 = 
            "size_t FindBlocksCommand(const uint16_t *, const size_t, const double, const size_t, const HistogramCommand *, double *, double *, uint8_t *, uint8_t *)"
            ;
            goto LAB_00114fc3;
          }
          if ((*(byte *)((long)pvVar38 + (ulong)(bVar29 >> 3)) >> (bVar29 & 7) & 1) != 0) {
            bVar35 = *(byte *)((long)pvVar42 + (sVar24 - 2));
            uVar15 = uVar15 + (bVar29 != bVar35);
            bVar29 = bVar35;
          }
          *(byte *)((long)pvVar42 + (sVar24 - 2)) = bVar29;
          pvVar38 = (void *)((long)pvVar38 - uVar7);
          sVar24 = sVar24 - 1;
        } while (sVar24 != 1);
      }
      if (uVar43 != 0) {
        uVar7 = 0;
        do {
          *(undefined2 *)((long)pvVar19 + uVar7 * 2) = 0x100;
          uVar7 = uVar7 + 1;
        } while (uVar43 != uVar7);
      }
      sVar24 = 0;
      uVar5 = 0;
      do {
        uVar7 = (ulong)*(byte *)((long)pvVar42 + sVar24);
        if (uVar43 <= uVar7) {
          pcVar28 = "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)"
          ;
          goto LAB_00114f57;
        }
        if (*(short *)((long)pvVar19 + uVar7 * 2) == 0x100) {
          *(ushort *)((long)pvVar19 + uVar7 * 2) = uVar5;
          uVar5 = uVar5 + 1;
        }
        sVar24 = sVar24 + 1;
      } while (num_commands != sVar24);
      uVar7 = (ulong)uVar5;
      sVar24 = 0;
      do {
        bVar29 = (byte)*(undefined2 *)((long)pvVar19 + (ulong)*(byte *)((long)pvVar42 + sVar24) * 2)
        ;
        *(byte *)((long)pvVar42 + sVar24) = bVar29;
        if (uVar43 <= bVar29) {
          pcVar28 = "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)"
          ;
          goto LAB_00114f76;
        }
        sVar24 = sVar24 + 1;
      } while (num_commands != sVar24);
      if (uVar43 < uVar7) {
        pcVar28 = "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)";
        goto LAB_0011503e;
      }
      if (uVar5 != 0) {
        lVar44 = 0;
        do {
          memset((void *)((long)pvVar14 + lVar44),0,0xb08);
          *(undefined8 *)((long)pvVar14 + lVar44 + 0xb08) = 0x7ff0000000000000;
          lVar44 = lVar44 + 0xb10;
        } while (uVar7 * 0xb10 - lVar44 != 0);
      }
      sVar24 = 0;
      do {
        lVar44 = (ulong)*(byte *)((long)pvVar42 + sVar24) * 0xb10;
        piVar1 = (int *)((long)pvVar14 + (ulong)*(ushort *)((long)pvVar11 + sVar24 * 2) * 4 + lVar44
                        );
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar14 + lVar44 + 0xb00);
        *plVar2 = *plVar2 + 1;
        sVar24 = sVar24 + 1;
      } while (num_commands != sVar24);
      lVar26 = lVar26 + 1;
      uVar43 = uVar7;
    } while (lVar26 != lVar41);
    BrotliFree(m,pvVar17);
    BrotliFree(m,pvVar18);
    BrotliFree(m,local_f90);
    BrotliFree(m,pvVar19);
    BrotliFree(m,pvVar14);
    if (uVar15 == 0) {
      local_fa0 = (uint32_t *)0x0;
      pvVar14 = (void *)0x0;
    }
    else {
      local_fa0 = (uint32_t *)BrotliAllocate(m,uVar15 * 4);
      pvVar14 = BrotliAllocate(m,uVar15 * 4);
    }
    uVar43 = uVar15 * 0x10 + 0x3f0;
    local_f78 = uVar43 >> 6;
    if (uVar43 < 0x40) {
      local_fc0 = (HistogramCommand *)0x0;
      local_fb0 = (uint32_t *)0x0;
    }
    else {
      local_fc0 = (HistogramCommand *)BrotliAllocate(m,local_f78 * 0xb10);
      local_fb0 = (uint32_t *)BrotliAllocate(m,local_f78 * 4);
    }
    if (uVar15 == 0) {
      local_fd8 = (HistogramCommand *)0x0;
    }
    else {
      uVar43 = 0x40;
      if (uVar15 < 0x40) {
        uVar43 = uVar15;
      }
      local_fd8 = (HistogramCommand *)BrotliAllocate(m,uVar43 * 0xb10);
    }
    local_f50 = (HistogramPair *)BrotliAllocate(m,0xc018);
    uVar43 = 0;
    memset(sizes,0,0x100);
    memset(new_clusters,0,0x100);
    memset(symbols,0,0x100);
    memset(remap,0,0x100);
    memset(pvVar14,0,uVar15 * 4);
    sVar24 = 0;
    do {
      if (uVar15 <= uVar43) {
        pcVar28 = 
        "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
        ;
        goto LAB_0011505d;
      }
      piVar1 = (int *)((long)pvVar14 + uVar43 * 4);
      *piVar1 = *piVar1 + 1;
      if ((sVar36 == sVar24) ||
         (*(char *)((long)pvVar42 + sVar24) != *(char *)((long)pvVar42 + sVar24 + 1))) {
        uVar43 = uVar43 + 1;
      }
      sVar24 = sVar24 + 1;
    } while (num_commands != sVar24);
    if (uVar43 != uVar15) {
      pcVar28 = 
      "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
      ;
      goto LAB_00115144;
    }
    if (uVar15 == 0) {
      uVar43 = 0;
    }
    else {
      local_f70 = 0;
      local_f98 = 0;
      local_ff0 = 0;
      uVar43 = 0;
      local_fb8 = 0.0;
      uVar7 = uVar15;
      puVar10 = local_fa0;
      local_f68 = (HistogramPair *)local_f78;
      do {
        uVar34 = 0x40;
        if (uVar7 < 0x40) {
          uVar34 = uVar7;
        }
        lVar41 = uVar34 + (uVar34 == 0);
        lVar26 = 0;
        do {
          pHVar13 = local_fd8 + lVar26;
          memset(pHVar13,0,0xb08);
          local_fd8[lVar26].bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar14 + (local_ff0 + lVar26) * 4) != 0) {
            sVar36 = pHVar13->total_count_;
            uVar34 = 0;
            do {
              pHVar13->data_[*(ushort *)((long)pvVar11 + uVar34 * 2 + (long)local_fb8 * 2)] =
                   pHVar13->data_[*(ushort *)((long)pvVar11 + uVar34 * 2 + (long)local_fb8 * 2)] + 1
              ;
              uVar34 = uVar34 + 1;
            } while (uVar34 < *(uint *)((long)pvVar14 + (local_ff0 + lVar26) * 4));
            pHVar13->total_count_ = sVar36 + uVar34;
            local_fb8 = (double)((long)local_fb8 + uVar34);
          }
          dVar46 = BrotliPopulationCostCommand(pHVar13);
          pHVar13->bit_cost_ = dVar46;
          new_clusters[lVar26] = (uint32_t)lVar26;
          symbols[lVar26] = (uint32_t)lVar26;
          sizes[lVar26] = 1;
          lVar26 = lVar26 + 1;
        } while (lVar26 != lVar41);
        sVar36 = uVar15 - local_ff0;
        if (0x3f < sVar36) {
          sVar36 = 0x40;
        }
        sVar36 = BrotliHistogramCombineCommand
                           (local_fd8,sizes,symbols,new_clusters,local_f50,sVar36,sVar36,0x40,0x800)
        ;
        uVar34 = local_f70 + sVar36;
        if (local_f68 < uVar34) {
          pHVar4 = local_f68;
          if (local_f68 == (HistogramPair *)0x0) {
            pHVar4 = (HistogramPair *)uVar34;
          }
          do {
            uVar37 = (ulong)pHVar4;
            pHVar4 = (HistogramPair *)(uVar37 * 2);
          } while (uVar37 < uVar34);
          if (uVar37 == 0) {
            pHVar13 = (HistogramCommand *)0x0;
          }
          else {
            pHVar13 = (HistogramCommand *)BrotliAllocate(m,uVar37 * 0xb10);
          }
          if (local_f68 != (HistogramPair *)0x0) {
            memcpy(pHVar13,local_fc0,(long)local_f68 * 0xb10);
          }
          BrotliFree(m,local_fc0);
          local_fc0 = pHVar13;
          local_f68 = (HistogramPair *)uVar37;
        }
        uVar34 = local_f98 + sVar36;
        if (local_f78 < uVar34) {
          uVar37 = local_f78;
          if (local_f78 == 0) {
            uVar37 = uVar34;
          }
          do {
            uVar20 = uVar37;
            uVar37 = uVar20 * 2;
          } while (uVar20 < uVar34);
          if (uVar20 == 0) {
            puVar22 = (uint32_t *)0x0;
          }
          else {
            puVar22 = (uint32_t *)BrotliAllocate(m,uVar20 * 4);
          }
          if (local_f78 != 0) {
            memcpy(puVar22,local_fb0,local_f78 << 2);
          }
          BrotliFree(m,local_fb0);
          local_fb0 = puVar22;
          local_f78 = uVar20;
        }
        if (sVar36 != 0) {
          pHVar13 = local_fc0 + local_f70;
          sVar24 = 0;
          do {
            uVar39 = new_clusters[sVar24];
            memcpy(pHVar13,local_fd8 + uVar39,0xb10);
            local_fb0[local_f98 + sVar24] = sizes[uVar39];
            remap[new_clusters[sVar24]] = (uint32_t)sVar24;
            sVar24 = sVar24 + 1;
            pHVar13 = pHVar13 + 1;
          } while (sVar36 != sVar24);
          local_f70 = local_f70 + sVar24;
          local_f98 = local_f98 + sVar24;
        }
        lVar26 = 0;
        do {
          puVar10[lVar26] = remap[symbols[lVar26]] + (int)uVar43;
          lVar26 = lVar26 + 1;
        } while (lVar41 != lVar26);
        uVar43 = sVar36 + uVar43;
        if (uVar43 != local_f98) {
          pcVar28 = 
          "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_001150d8;
        }
        if (uVar43 != local_f70) {
          pcVar28 = 
          "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_001150f7;
        }
        local_ff0 = local_ff0 + 0x40;
        uVar7 = uVar7 - 0x40;
        puVar10 = puVar10 + 0x40;
      } while (local_ff0 < uVar15);
    }
    BrotliFree(m,local_fd8);
    uVar7 = (uVar43 >> 1) * uVar43;
    if (uVar43 << 6 < uVar7) {
      uVar7 = uVar43 << 6;
    }
    if (0x800 < uVar7) {
      BrotliFree(m,local_f50);
      local_f50 = (HistogramPair *)BrotliAllocate(m,uVar7 * 0x18 + 0x18);
    }
    if (uVar43 == 0) {
      puVar10 = (uint32_t *)0x0;
    }
    else {
      puVar10 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
      uVar34 = 0;
      do {
        puVar10[uVar34] = (uint32_t)uVar34;
        uVar34 = uVar34 + 1;
      } while (uVar43 != uVar34);
    }
    sVar36 = BrotliHistogramCombineCommand
                       (local_fc0,local_fb0,local_fa0,puVar10,local_f50,uVar43,uVar15,0x100,uVar7);
    BrotliFree(m,local_f50);
    BrotliFree(m,local_fb0);
    if (uVar43 == 0) {
      local_fc8 = (HistogramDistance *)0x0;
    }
    else {
      local_fc8 = (HistogramDistance *)BrotliAllocate(m,uVar43 * 4);
      memset(local_fc8,0xff,uVar43 << 2);
    }
    if (uVar15 != 0) {
      iVar23 = 0;
      uVar43 = 0;
      local_ff0 = 0;
      do {
        memset(local_b40,0,0xb08);
        local_38 = INFINITY;
        if (*(int *)((long)pvVar14 + uVar43 * 4) != 0) {
          uVar7 = 0;
          do {
            *(int *)(local_b40 + (ulong)*(ushort *)((long)pvVar11 + uVar7 * 2 + local_ff0 * 2) * 4)
                 = *(int *)(local_b40 +
                           (ulong)*(ushort *)((long)pvVar11 + uVar7 * 2 + local_ff0 * 2) * 4) + 1;
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(uint *)((long)pvVar14 + uVar43 * 4));
          local_ff0 = local_ff0 + uVar7;
          local_40 = uVar7;
        }
        lVar41 = 0;
        if (uVar43 != 0) {
          lVar41 = uVar43 - 1;
        }
        uVar39 = local_fa0[lVar41];
        uVar7 = (ulong)uVar39;
        local_fb8 = BrotliHistogramBitCostDistanceCommand
                              ((HistogramCommand *)local_b40,local_fc0 + uVar7);
        if (sVar36 != 0) {
          sVar24 = 0;
          do {
            dVar46 = BrotliHistogramBitCostDistanceCommand
                               ((HistogramCommand *)local_b40,local_fc0 + puVar10[sVar24]);
            if (dVar46 < local_fb8) {
              uVar7 = (ulong)puVar10[sVar24];
              local_fb8 = dVar46;
            }
            uVar39 = (uint)uVar7;
            sVar24 = sVar24 + 1;
          } while (sVar36 != sVar24);
        }
        local_fa0[uVar43] = uVar39;
        if (*(int *)((long)local_fc8 + (ulong)uVar39 * 4) == -1) {
          *(int *)((long)local_fc8 + (ulong)uVar39 * 4) = iVar23;
          iVar23 = iVar23 + 1;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != uVar15);
    }
    BrotliFree(m,puVar10);
    BrotliFree(m,local_fc0);
    uVar43 = insert_and_copy_split->types_alloc_size;
    if (uVar43 < uVar15) {
      if (uVar43 == 0) {
        uVar43 = uVar15;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar15);
      if (uVar7 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar7);
      }
      if (insert_and_copy_split->types_alloc_size != 0) {
        memcpy(puVar8,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar8;
      insert_and_copy_split->types_alloc_size = uVar7;
    }
    uVar43 = insert_and_copy_split->lengths_alloc_size;
    if (uVar43 < uVar15) {
      if (uVar43 == 0) {
        uVar43 = uVar15;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar15);
      if (uVar7 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar7 * 4);
      }
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        memcpy(puVar10,insert_and_copy_split->lengths,insert_and_copy_split->lengths_alloc_size << 2
              );
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar10;
      insert_and_copy_split->lengths_alloc_size = uVar7;
    }
    uVar30 = 0;
    if (uVar15 == 0) {
      sVar24 = 1;
      sVar36 = 0;
    }
    else {
      sVar36 = 0;
      uVar43 = 0;
      uVar39 = 0;
      do {
        uVar30 = uVar30 + *(int *)((long)pvVar14 + uVar43 * 4);
        if ((uVar15 - 1 == uVar43) || (local_fa0[uVar43] != local_fa0[uVar43 + 1])) {
          uVar33 = uVar39 & 0xff;
          uVar3 = *(uint *)((long)local_fc8 + (ulong)local_fa0[uVar43] * 4);
          bVar35 = (byte)uVar3;
          insert_and_copy_split->types[sVar36] = bVar35;
          bVar29 = (byte)uVar39;
          uVar39 = uVar3;
          if (bVar35 < bVar29) {
            uVar39 = uVar33;
          }
          insert_and_copy_split->lengths[sVar36] = uVar30;
          sVar36 = sVar36 + 1;
          uVar30 = 0;
        }
        uVar43 = uVar43 + 1;
      } while (uVar15 != uVar43);
      sVar24 = (ulong)(uVar39 & 0xff) + 1;
    }
    insert_and_copy_split->num_blocks = sVar36;
    insert_and_copy_split->num_types = sVar24;
    BrotliFree(m,local_fc8);
    BrotliFree(m,pvVar14);
    BrotliFree(m,local_fa0);
    BrotliFree(m,pvVar42);
  }
  BrotliFree(m,pvVar11);
  if (num_commands == 0) {
    pvVar11 = (void *)0x0;
    local_fd0 = 0;
  }
  else {
    pvVar11 = BrotliAllocate(m,num_commands * 2);
    puVar12 = &cmds->dist_prefix_;
    local_fd0 = 0;
    do {
      if (((*(uint *)(puVar12 + -5) & 0xffffff) != 0) && (0x7f < puVar12[-1])) {
        *(uint16_t *)((long)pvVar11 + local_fd0 * 2) = *puVar12;
        local_fd0 = local_fd0 + 1;
      }
      puVar12 = puVar12 + 8;
      num_commands = num_commands - 1;
    } while (num_commands != 0);
  }
  uVar43 = 0x32;
  if (local_fd0 < 0x6a40) {
    uVar43 = local_fd0 / 0x220 + 1;
  }
  if (local_fd0 == 0) {
    dist_split->num_types = 1;
  }
  else if (local_fd0 < 0x80) {
    uVar43 = dist_split->types_alloc_size;
    uVar7 = dist_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar15 = uVar43;
        uVar43 = uVar15 * 2;
      } while (uVar15 < uVar7);
      if (uVar15 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar15);
      }
      if (dist_split->types_alloc_size != 0) {
        memcpy(puVar8,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar8;
      dist_split->types_alloc_size = uVar15;
    }
    uVar43 = dist_split->lengths_alloc_size;
    uVar7 = dist_split->num_blocks + 1;
    if (uVar43 < uVar7) {
      if (uVar43 == 0) {
        uVar43 = uVar7;
      }
      do {
        uVar15 = uVar43;
        uVar43 = uVar15 * 2;
      } while (uVar15 < uVar7);
      if (uVar15 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar15 * 4);
      }
      if (dist_split->lengths_alloc_size != 0) {
        memcpy(puVar10,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar10;
      dist_split->lengths_alloc_size = uVar15;
    }
    dist_split->num_types = 1;
    dist_split->types[dist_split->num_blocks] = '\0';
    sVar36 = dist_split->num_blocks;
    dist_split->lengths[sVar36] = (uint32_t)local_fd0;
    dist_split->num_blocks = sVar36 + 1;
  }
  else {
    pvVar14 = BrotliAllocate(m,uVar43 * 0x830);
    uVar7 = uVar43;
    pvVar42 = pvVar14;
    do {
      memset(pvVar42,0,0x828);
      *(undefined8 *)((long)pvVar42 + 0x828) = 0x7ff0000000000000;
      pvVar42 = (void *)((long)pvVar42 + 0x830);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar7 = 0;
    iVar23 = 7;
    do {
      uVar15 = (uVar7 * local_fd0) / uVar43;
      if (uVar7 != 0) {
        uVar34 = (ulong)(uint)(iVar23 * 0x41a7);
        if (iVar23 == 0) {
          uVar34 = 1;
        }
        uVar15 = uVar15 + uVar34 % (local_fd0 / uVar43);
        iVar23 = (int)uVar34;
      }
      if (local_fd0 <= uVar15 + 0x28) {
        uVar15 = local_fd0 - 0x29;
      }
      plVar2 = (long *)((long)pvVar14 + uVar7 * 0x830 + 0x820);
      *plVar2 = *plVar2 + 0x28;
      lVar41 = 0;
      do {
        piVar1 = (int *)((long)pvVar14 +
                        (ulong)*(ushort *)((long)pvVar11 + lVar41 * 2 + uVar15 * 2) * 4 +
                        uVar7 * 0x830);
        *piVar1 = *piVar1 + 1;
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0x28);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar43);
    uVar7 = (local_fd0 * 2) / 0x28 + uVar43 + 99;
    if (uVar7 != uVar7 % uVar43) {
      uVar34 = 7;
      uVar15 = 0;
      do {
        memset(local_b40,0,0x828);
        uVar39 = (int)uVar34 * 0x41a7;
        if ((int)uVar34 == 0) {
          uVar39 = 1;
        }
        uVar34 = (ulong)uVar39;
        local_318 = INFINITY;
        puVar16 = (ushort *)((long)pvVar11 + (uVar34 % (local_fd0 - 0x27)) * 2);
        local_320 = 0x28;
        lVar41 = -0x28;
        do {
          uVar5 = *puVar16;
          puVar16 = puVar16 + 1;
          *(int *)(local_b40 + (ulong)uVar5 * 4) = *(int *)(local_b40 + (ulong)uVar5 * 4) + 1;
          lVar41 = lVar41 + 1;
        } while (lVar41 != 0);
        lVar41 = (uVar15 % uVar43) * 0x830;
        plVar2 = (long *)((long)pvVar14 + lVar41 + 0x820);
        *plVar2 = *plVar2 + 0x28;
        lVar26 = 0;
        do {
          piVar1 = (int *)((long)pvVar14 + lVar26 * 4 + lVar41);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x208);
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar7 - uVar7 % uVar43);
    }
    pvVar42 = BrotliAllocate(m,local_fd0);
    pvVar17 = BrotliAllocate(m,uVar43 * 0x1040);
    pvVar18 = BrotliAllocate(m,uVar43 * 8);
    sVar36 = (uVar43 + 7 >> 3) * local_fd0;
    if (sVar36 == 0) {
      local_f80 = (void *)0x0;
    }
    else {
      local_f80 = BrotliAllocate(m,sVar36);
    }
    pvVar19 = BrotliAllocate(m,uVar43 * 2);
    lVar41 = 3;
    if (10 < params->quality) {
      lVar41 = 10;
    }
    uVar7 = local_fd0 - 1;
    lVar26 = 0;
    do {
      if (uVar43 < 2) {
        memset(pvVar42,0,local_fd0);
LAB_0011428e:
        uVar37 = 1;
      }
      else {
        uVar15 = uVar43 + 7 >> 3;
        memset(pvVar17,0,uVar43 * 0x1040);
        uVar34 = 0;
        puVar32 = (uint *)((long)pvVar14 + 0x820);
        do {
          uVar37 = (ulong)*puVar32;
          if (uVar37 < 0x100) {
            dVar46 = (double)kLog2Table[uVar37];
          }
          else {
            dVar46 = log2((double)uVar37);
          }
          *(double *)((long)pvVar17 + uVar34 * 8) = dVar46;
          uVar34 = uVar34 + 1;
          puVar32 = puVar32 + 0x20c;
        } while (uVar43 != uVar34);
        pvVar38 = (void *)(uVar43 * 0x1038 + (long)pvVar17);
        lVar44 = 0x208;
        puVar32 = (uint *)((long)pvVar14 + 0x81c);
        do {
          lVar44 = lVar44 + -1;
          uVar34 = 0;
          puVar40 = puVar32;
          do {
            dVar46 = *(double *)((long)pvVar17 + uVar34 * 8);
            uVar37 = (ulong)*puVar40;
            dVar45 = -2.0;
            if (uVar37 != 0) {
              if (*puVar40 < 0x100) {
                dVar45 = (double)kLog2Table[uVar37];
              }
              else {
                dVar45 = log2((double)uVar37);
              }
            }
            *(double *)((long)pvVar38 + uVar34 * 8) = dVar46 - dVar45;
            uVar34 = uVar34 + 1;
            puVar40 = puVar40 + 0x20c;
          } while (uVar43 != uVar34);
          pvVar38 = (void *)((long)pvVar38 + uVar43 * -8);
          puVar32 = puVar32 + -1;
        } while (lVar44 != 0);
        memset(pvVar18,0,uVar43 * 8);
        memset(local_f80,0,uVar15 * local_fd0);
        uVar34 = 0;
        do {
          uVar5 = *(ushort *)((long)pvVar11 + uVar34 * 2);
          uVar37 = 0;
          dVar46 = 1e+99;
          do {
            dVar45 = *(double *)((long)pvVar17 + uVar37 * 8 + uVar5 * uVar43 * 8) +
                     *(double *)((long)pvVar18 + uVar37 * 8);
            *(double *)((long)pvVar18 + uVar37 * 8) = dVar45;
            if (dVar45 < dVar46) {
              *(char *)((long)pvVar42 + uVar34) = (char)uVar37;
              dVar46 = dVar45;
            }
            uVar37 = uVar37 + 1;
          } while (uVar43 != uVar37);
          dVar45 = 14.6;
          if (uVar34 < 2000) {
            dVar45 = (((double)(long)uVar34 * 0.07) / 2000.0 + 0.77) * 14.6;
          }
          uVar37 = 0;
          do {
            dVar47 = *(double *)((long)pvVar18 + uVar37 * 8) - dVar46;
            *(double *)((long)pvVar18 + uVar37 * 8) = dVar47;
            if (dVar45 <= dVar47) {
              *(double *)((long)pvVar18 + uVar37 * 8) = dVar45;
              if (uVar15 <= uVar37 >> 3) {
                pcVar28 = 
                "size_t FindBlocksDistance(const uint16_t *, const size_t, const double, const size_t, const HistogramDistance *, double *, double *, uint8_t *, uint8_t *)"
                ;
LAB_00114edc:
                __assert_fail("(k >> 3) < bitmaplen",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                              ,0x82,pcVar28);
              }
              pbVar31 = (byte *)((long)local_f80 + (uVar37 >> 3) + uVar34 * uVar15);
              *pbVar31 = *pbVar31 | '\x01' << ((byte)uVar37 & 7);
            }
            uVar37 = uVar37 + 1;
          } while (uVar43 != uVar37);
          uVar34 = uVar34 + 1;
        } while (uVar34 != local_fd0);
        if (uVar7 == 0) goto LAB_0011428e;
        bVar29 = *(byte *)((long)pvVar42 + uVar7);
        pvVar38 = (void *)((local_fd0 - 2) * uVar15 + (long)local_f80);
        uVar37 = 1;
        uVar34 = local_fd0;
        do {
          if (uVar15 <= bVar29 >> 3) {
            pcVar28 = 
            "size_t FindBlocksDistance(const uint16_t *, const size_t, const double, const size_t, const HistogramDistance *, double *, double *, uint8_t *, uint8_t *)"
            ;
LAB_00114fc3:
            __assert_fail("((size_t)cur_id >> 3) < bitmaplen",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                          ,0x8d,pcVar28);
          }
          if ((*(byte *)((long)pvVar38 + (ulong)(bVar29 >> 3)) >> (bVar29 & 7) & 1) != 0) {
            bVar35 = *(byte *)((long)pvVar42 + (uVar34 - 2));
            uVar37 = uVar37 + (bVar29 != bVar35);
            bVar29 = bVar35;
          }
          *(byte *)((long)pvVar42 + (uVar34 - 2)) = bVar29;
          pvVar38 = (void *)((long)pvVar38 - uVar15);
          uVar34 = uVar34 - 1;
        } while (uVar34 != 1);
      }
      if (uVar43 != 0) {
        uVar15 = 0;
        do {
          *(undefined2 *)((long)pvVar19 + uVar15 * 2) = 0x100;
          uVar15 = uVar15 + 1;
        } while (uVar43 != uVar15);
      }
      uVar15 = 0;
      uVar5 = 0;
      do {
        uVar34 = (ulong)*(byte *)((long)pvVar42 + uVar15);
        if (uVar43 <= uVar34) {
          pcVar28 = 
          "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_00114f57:
          __assert_fail("block_ids[i] < num_histograms",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                        ,0xa5,pcVar28);
        }
        if (*(short *)((long)pvVar19 + uVar34 * 2) == 0x100) {
          *(ushort *)((long)pvVar19 + uVar34 * 2) = uVar5;
          uVar5 = uVar5 + 1;
        }
        uVar15 = uVar15 + 1;
      } while (local_fd0 != uVar15);
      uVar34 = (ulong)uVar5;
      uVar15 = 0;
      do {
        bVar29 = (byte)*(undefined2 *)((long)pvVar19 + (ulong)*(byte *)((long)pvVar42 + uVar15) * 2)
        ;
        *(byte *)((long)pvVar42 + uVar15) = bVar29;
        if (uVar43 <= bVar29) {
          pcVar28 = 
          "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_00114f76:
          __assert_fail("block_ids[i] < num_histograms",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                        ,0xac,pcVar28);
        }
        uVar15 = uVar15 + 1;
      } while (local_fd0 != uVar15);
      if (uVar43 < uVar34) {
        pcVar28 = "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_0011503e:
        __assert_fail("next_id <= num_histograms",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                      ,0xae,pcVar28);
      }
      if (uVar5 != 0) {
        lVar44 = 0;
        do {
          memset((void *)((long)pvVar14 + lVar44),0,0x828);
          *(undefined8 *)((long)pvVar14 + lVar44 + 0x828) = 0x7ff0000000000000;
          lVar44 = lVar44 + 0x830;
        } while (uVar34 * 0x830 - lVar44 != 0);
      }
      uVar43 = 0;
      do {
        lVar44 = (ulong)*(byte *)((long)pvVar42 + uVar43) * 0x830;
        piVar1 = (int *)((long)pvVar14 + (ulong)*(ushort *)((long)pvVar11 + uVar43 * 2) * 4 + lVar44
                        );
        *piVar1 = *piVar1 + 1;
        plVar2 = (long *)((long)pvVar14 + lVar44 + 0x820);
        *plVar2 = *plVar2 + 1;
        uVar43 = uVar43 + 1;
      } while (local_fd0 != uVar43);
      lVar26 = lVar26 + 1;
      uVar43 = uVar34;
    } while (lVar26 != lVar41);
    BrotliFree(m,pvVar17);
    BrotliFree(m,pvVar18);
    BrotliFree(m,local_f80);
    BrotliFree(m,pvVar19);
    BrotliFree(m,pvVar14);
    if (uVar37 == 0) {
      local_ff8 = (uint32_t *)0x0;
      pvVar14 = (void *)0x0;
    }
    else {
      local_ff8 = (uint32_t *)BrotliAllocate(m,uVar37 * 4);
      pvVar14 = BrotliAllocate(m,uVar37 * 4);
    }
    uVar43 = uVar37 * 0x10 + 0x3f0;
    local_f78 = uVar43 >> 6;
    if (uVar43 < 0x40) {
      local_fc0 = (HistogramCommand *)0x0;
      local_fb0 = (uint32_t *)0x0;
    }
    else {
      local_fc0 = (HistogramCommand *)BrotliAllocate(m,local_f78 * 0x830);
      local_fb0 = (uint32_t *)BrotliAllocate(m,local_f78 * 4);
    }
    if (uVar37 == 0) {
      local_fc8 = (HistogramDistance *)0x0;
    }
    else {
      uVar43 = 0x40;
      if (uVar37 < 0x40) {
        uVar43 = uVar37;
      }
      local_fc8 = (HistogramDistance *)BrotliAllocate(m,uVar43 * 0x830);
    }
    local_f68 = (HistogramPair *)BrotliAllocate(m,0xc018);
    uVar15 = 0;
    memset(sizes,0,0x100);
    memset(new_clusters,0,0x100);
    memset(symbols,0,0x100);
    memset(remap,0,0x100);
    memset(pvVar14,0,uVar37 * 4);
    uVar43 = 0;
    do {
      if (uVar37 <= uVar15) {
        pcVar28 = 
        "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
        ;
LAB_0011505d:
        __assert_fail("block_idx < num_blocks",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                      ,0xe7,pcVar28);
      }
      piVar1 = (int *)((long)pvVar14 + uVar15 * 4);
      *piVar1 = *piVar1 + 1;
      if ((uVar7 == uVar43) ||
         (*(char *)((long)pvVar42 + uVar43) != *(char *)((long)pvVar42 + uVar43 + 1))) {
        uVar15 = uVar15 + 1;
      }
      uVar43 = uVar43 + 1;
    } while (local_fd0 != uVar43);
    if (uVar15 != uVar37) {
      pcVar28 = 
      "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
      ;
LAB_00115144:
      __assert_fail("block_idx == num_blocks",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                    ,0xed,pcVar28);
    }
    if (uVar37 == 0) {
      uVar43 = 0;
    }
    else {
      local_f70 = 0;
      local_f98 = 0;
      local_ff0 = 0;
      uVar43 = 0;
      local_fb8 = 0.0;
      uVar7 = uVar37;
      puVar10 = local_ff8;
      uVar15 = local_f78;
      do {
        uVar34 = 0x40;
        if (uVar7 < 0x40) {
          uVar34 = uVar7;
        }
        lVar26 = uVar34 + (uVar34 == 0);
        lVar41 = 0;
        do {
          pHVar21 = local_fc8 + lVar41;
          memset(pHVar21,0,0x828);
          local_fc8[lVar41].bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar14 + (local_ff0 + lVar41) * 4) != 0) {
            sVar36 = pHVar21->total_count_;
            uVar34 = 0;
            do {
              pHVar21->data_[*(ushort *)((long)pvVar11 + uVar34 * 2 + (long)local_fb8 * 2)] =
                   pHVar21->data_[*(ushort *)((long)pvVar11 + uVar34 * 2 + (long)local_fb8 * 2)] + 1
              ;
              uVar34 = uVar34 + 1;
            } while (uVar34 < *(uint *)((long)pvVar14 + (local_ff0 + lVar41) * 4));
            pHVar21->total_count_ = sVar36 + uVar34;
            local_fb8 = (double)((long)local_fb8 + uVar34);
          }
          dVar46 = BrotliPopulationCostDistance(pHVar21);
          pHVar21->bit_cost_ = dVar46;
          new_clusters[lVar41] = (uint32_t)lVar41;
          symbols[lVar41] = (uint32_t)lVar41;
          sizes[lVar41] = 1;
          lVar41 = lVar41 + 1;
        } while (lVar41 != lVar26);
        sVar36 = uVar37 - local_ff0;
        if (0x3f < sVar36) {
          sVar36 = 0x40;
        }
        sVar36 = BrotliHistogramCombineDistance
                           (local_fc8,sizes,symbols,new_clusters,local_f68,sVar36,sVar36,0x40,0x800)
        ;
        uVar20 = local_f70 + sVar36;
        uVar34 = uVar15;
        if (uVar15 < uVar20) {
          uVar27 = uVar15;
          if (uVar15 == 0) {
            uVar27 = uVar20;
          }
          do {
            uVar34 = uVar27;
            uVar27 = uVar34 * 2;
          } while (uVar34 < uVar20);
          if (uVar34 == 0) {
            pHVar21 = (HistogramDistance *)0x0;
          }
          else {
            pHVar21 = (HistogramDistance *)BrotliAllocate(m,uVar34 * 0x830);
          }
          if (uVar15 != 0) {
            memcpy(pHVar21,local_fc0,uVar15 * 0x830);
          }
          BrotliFree(m,local_fc0);
          local_fc0 = (HistogramCommand *)pHVar21;
        }
        uVar15 = local_f98 + sVar36;
        if (local_f78 < uVar15) {
          uVar20 = local_f78;
          if (local_f78 == 0) {
            uVar20 = uVar15;
          }
          do {
            uVar27 = uVar20;
            uVar20 = uVar27 * 2;
          } while (uVar27 < uVar15);
          if (uVar27 == 0) {
            puVar22 = (uint32_t *)0x0;
          }
          else {
            puVar22 = (uint32_t *)BrotliAllocate(m,uVar27 * 4);
          }
          if (local_f78 != 0) {
            memcpy(puVar22,local_fb0,local_f78 << 2);
          }
          BrotliFree(m,local_fb0);
          local_fb0 = puVar22;
          local_f78 = uVar27;
        }
        if (sVar36 != 0) {
          pHVar21 = (HistogramDistance *)((long)local_fc0 + local_f70 * 0x830);
          sVar24 = 0;
          do {
            uVar39 = new_clusters[sVar24];
            memcpy(pHVar21,local_fc8 + uVar39,0x830);
            local_fb0[local_f98 + sVar24] = sizes[uVar39];
            remap[new_clusters[sVar24]] = (uint32_t)sVar24;
            sVar24 = sVar24 + 1;
            pHVar21 = pHVar21 + 1;
          } while (sVar36 != sVar24);
          local_f70 = local_f70 + sVar24;
          local_f98 = local_f98 + sVar24;
        }
        lVar41 = 0;
        do {
          puVar10[lVar41] = remap[symbols[lVar41]] + (int)uVar43;
          lVar41 = lVar41 + 1;
        } while (lVar26 != lVar41);
        uVar43 = sVar36 + uVar43;
        if (uVar43 != local_f98) {
          pcVar28 = 
          "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
LAB_001150d8:
          __assert_fail("num_clusters == cluster_size_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                        ,0x111,pcVar28);
        }
        if (uVar43 != local_f70) {
          pcVar28 = 
          "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
LAB_001150f7:
          __assert_fail("num_clusters == all_histograms_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                        ,0x112,pcVar28);
        }
        local_ff0 = local_ff0 + 0x40;
        uVar7 = uVar7 - 0x40;
        puVar10 = puVar10 + 0x40;
        uVar15 = uVar34;
      } while (local_ff0 < uVar37);
    }
    BrotliFree(m,local_fc8);
    uVar7 = (uVar43 >> 1) * uVar43;
    if (uVar43 << 6 < uVar7) {
      uVar7 = uVar43 << 6;
    }
    if (0x800 < uVar7) {
      BrotliFree(m,local_f68);
      local_f68 = (HistogramPair *)BrotliAllocate(m,uVar7 * 0x18 + 0x18);
    }
    if (uVar43 == 0) {
      puVar10 = (uint32_t *)0x0;
    }
    else {
      puVar10 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
      uVar15 = 0;
      do {
        puVar10[uVar15] = (uint32_t)uVar15;
        uVar15 = uVar15 + 1;
      } while (uVar43 != uVar15);
    }
    sVar36 = BrotliHistogramCombineDistance
                       ((HistogramDistance *)local_fc0,local_fb0,local_ff8,puVar10,local_f68,uVar43,
                        uVar37,0x100,uVar7);
    BrotliFree(m,local_f68);
    BrotliFree(m,local_fb0);
    if (uVar43 == 0) {
      pvVar17 = (void *)0x0;
    }
    else {
      pvVar17 = BrotliAllocate(m,uVar43 * 4);
      memset(pvVar17,0xff,uVar43 << 2);
    }
    if (uVar37 != 0) {
      iVar23 = 0;
      uVar43 = 0;
      local_ff0 = 0;
      do {
        memset(local_b40,0,0x828);
        local_318 = INFINITY;
        if (*(int *)((long)pvVar14 + uVar43 * 4) != 0) {
          uVar7 = 0;
          do {
            *(int *)(local_b40 + (ulong)*(ushort *)((long)pvVar11 + uVar7 * 2 + local_ff0 * 2) * 4)
                 = *(int *)(local_b40 +
                           (ulong)*(ushort *)((long)pvVar11 + uVar7 * 2 + local_ff0 * 2) * 4) + 1;
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(uint *)((long)pvVar14 + uVar43 * 4));
          local_ff0 = local_ff0 + uVar7;
          local_320 = uVar7;
        }
        lVar41 = 0;
        if (uVar43 != 0) {
          lVar41 = uVar43 - 1;
        }
        uVar39 = local_ff8[lVar41];
        uVar7 = (ulong)uVar39;
        local_fb8 = BrotliHistogramBitCostDistanceDistance
                              ((HistogramDistance *)local_b40,
                               (HistogramDistance *)((long)local_fc0 + uVar7 * 0x830));
        if (sVar36 != 0) {
          sVar24 = 0;
          do {
            dVar46 = BrotliHistogramBitCostDistanceDistance
                               ((HistogramDistance *)local_b40,
                                (HistogramDistance *)
                                ((long)local_fc0 + (ulong)puVar10[sVar24] * 0x830));
            if (dVar46 < local_fb8) {
              uVar7 = (ulong)puVar10[sVar24];
              local_fb8 = dVar46;
            }
            uVar39 = (uint)uVar7;
            sVar24 = sVar24 + 1;
          } while (sVar36 != sVar24);
        }
        local_ff8[uVar43] = uVar39;
        if (*(int *)((long)pvVar17 + (ulong)uVar39 * 4) == -1) {
          *(int *)((long)pvVar17 + (ulong)uVar39 * 4) = iVar23;
          iVar23 = iVar23 + 1;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != uVar37);
    }
    BrotliFree(m,puVar10);
    BrotliFree(m,local_fc0);
    uVar43 = dist_split->types_alloc_size;
    if (uVar43 < uVar37) {
      if (uVar43 == 0) {
        uVar43 = uVar37;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar37);
      if (uVar7 == 0) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = (uint8_t *)BrotliAllocate(m,uVar7);
      }
      if (dist_split->types_alloc_size != 0) {
        memcpy(puVar8,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar8;
      dist_split->types_alloc_size = uVar7;
    }
    uVar43 = dist_split->lengths_alloc_size;
    if (uVar43 < uVar37) {
      if (uVar43 == 0) {
        uVar43 = uVar37;
      }
      do {
        uVar7 = uVar43;
        uVar43 = uVar7 * 2;
      } while (uVar7 < uVar37);
      if (uVar7 == 0) {
        puVar10 = (uint32_t *)0x0;
      }
      else {
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar7 * 4);
      }
      if (dist_split->lengths_alloc_size != 0) {
        memcpy(puVar10,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar10;
      dist_split->lengths_alloc_size = uVar7;
    }
    uVar30 = 0;
    if (uVar37 == 0) {
      sVar24 = 1;
      sVar36 = 0;
    }
    else {
      sVar36 = 0;
      uVar43 = 0;
      uVar39 = 0;
      do {
        uVar30 = uVar30 + *(int *)((long)pvVar14 + uVar43 * 4);
        if ((uVar37 - 1 == uVar43) || (local_ff8[uVar43] != local_ff8[uVar43 + 1])) {
          uVar33 = uVar39 & 0xff;
          uVar3 = *(uint *)((long)pvVar17 + (ulong)local_ff8[uVar43] * 4);
          bVar35 = (byte)uVar3;
          dist_split->types[sVar36] = bVar35;
          bVar29 = (byte)uVar39;
          uVar39 = uVar3;
          if (bVar35 < bVar29) {
            uVar39 = uVar33;
          }
          dist_split->lengths[sVar36] = uVar30;
          sVar36 = sVar36 + 1;
          uVar30 = 0;
        }
        uVar43 = uVar43 + 1;
      } while (uVar37 != uVar43);
      sVar24 = (ulong)(uVar39 & 0xff) + 1;
    }
    dist_split->num_blocks = sVar36;
    dist_split->num_types = sVar24;
    BrotliFree(m,pvVar17);
    BrotliFree(m,pvVar14);
    BrotliFree(m,local_ff8);
    BrotliFree(m,pvVar42);
  }
  BrotliFree(m,pvVar11);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
       Literal histograms have alphabet size 256. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}